

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O0

optional<QJsonDocument> __thiscall QRestReply::readJson(QRestReply *this,QJsonParseError *error)

{
  bool bVar1;
  QJsonParseError *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  char *in_RSI;
  _Storage<QJsonDocument,_false> in_RDI;
  long in_FS_OFFSET;
  optional<QJsonDocument> oVar3;
  QJsonDocument doc;
  QByteArray data;
  QJsonParseError parseError;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  _Storage<QJsonDocument,_false> this_00;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QByteArray local_70;
  undefined8 local_58;
  QJsonParseError local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  char local_40 [32];
  undefined4 local_20;
  undefined4 uStack_1c;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QPointer::operator_cast_to_bool((QPointer<QNetworkReply> *)0x3338e6);
  if (bVar1) {
    QPointer<QNetworkReply>::operator->((QPointer<QNetworkReply> *)0x333930);
    bVar1 = QNetworkReply::isFinished((QNetworkReply *)0x333938);
    if (bVar1) {
      local_50.offset = -0x55555556;
      local_50.error = 0xaaaaaaaa;
      QJsonParseError::QJsonParseError(&local_50);
      local_70.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      local_70.d.size = -0x5555555555555556;
      local_58 = 0xaaaaaaaaaaaaaaaa;
      QPointer<QNetworkReply>::operator->((QPointer<QNetworkReply> *)0x333a3d);
      QIODevice::readAll();
      local_70.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      QJsonDocument::fromJson(&local_70,(QJsonParseError *)&local_70.d.ptr);
      if (in_RDX != (QJsonParseError *)0x0) {
        *in_RDX = local_50;
      }
      if (local_50.error == NoError) {
        std::optional<QJsonDocument>::optional<const_QJsonDocument,_true>
                  ((optional<QJsonDocument> *)this_00,(QJsonDocument *)in_RDI);
      }
      else {
        std::optional<QJsonDocument>::optional((optional<QJsonDocument> *)in_RDI.field2);
      }
      QJsonDocument::~QJsonDocument((QJsonDocument *)&local_70);
      QByteArray::~QByteArray((QByteArray *)0x333ac3);
      uVar2 = extraout_RDX_01;
    }
    else {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQrest();
      anon_unknown.dwarf_803d4f::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)this_00,(QLoggingCategory *)in_RDI);
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_18);
        if (!bVar1) break;
        anon_unknown.dwarf_803d4f::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x333993);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_RSI,this_00._4_4_,(char *)in_RDI,(char *)0x3339a9);
        QMessageLogger::warning(local_40,"readJson() called on an unfinished reply, ignoring");
        local_10 = local_10 & 0xffffffffffffff00;
      }
      if (in_RDX != (QJsonParseError *)0x0) {
        local_48 = 0;
        uStack_44 = 0;
        in_RDX->offset = 0;
        in_RDX->error = NoError;
      }
      std::optional<QJsonDocument>::optional((optional<QJsonDocument> *)in_RDI.field2);
      uVar2 = extraout_RDX_00;
    }
  }
  else {
    if (in_RDX != (QJsonParseError *)0x0) {
      local_20 = 0;
      uStack_1c = 0;
      in_RDX->offset = 0;
      in_RDX->error = NoError;
    }
    std::optional<QJsonDocument>::optional((optional<QJsonDocument> *)in_RDI.field2);
    uVar2 = extraout_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar3.super__Optional_base<QJsonDocument,_false,_false>._M_payload.
    super__Optional_payload<QJsonDocument,_true,_false,_false>.
    super__Optional_payload_base<QJsonDocument>._8_8_ = uVar2;
    oVar3.super__Optional_base<QJsonDocument,_false,_false>._M_payload.
    super__Optional_payload<QJsonDocument,_true,_false,_false>.
    super__Optional_payload_base<QJsonDocument>._M_payload.field2 = this_00.field2;
    return (optional<QJsonDocument>)
           oVar3.super__Optional_base<QJsonDocument,_false,_false>._M_payload.
           super__Optional_payload<QJsonDocument,_true,_false,_false>.
           super__Optional_payload_base<QJsonDocument>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<QJsonDocument> QRestReply::readJson(QJsonParseError *error)
{
    if (!wrapped) {
        if (error)
            *error = {0, QJsonParseError::ParseError::NoError};
        return std::nullopt;
    }

    if (!wrapped->isFinished()) {
        qCWarning(lcQrest, "readJson() called on an unfinished reply, ignoring");
        if (error)
            *error = {0, QJsonParseError::ParseError::NoError};
        return std::nullopt;
    }
    QJsonParseError parseError;
    const QByteArray data = wrapped->readAll();
    const QJsonDocument doc = QJsonDocument::fromJson(data, &parseError);
    if (error)
        *error = parseError;
    if (parseError.error)
        return std::nullopt;
    return doc;
}